

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::SeekHead::Write(SeekHead *this,IMkvWriter *writer)

{
  int iVar1;
  uint64_t uVar2;
  uint64 uVar3;
  undefined4 extraout_var;
  
  uVar2 = MaxEntrySize(this);
  uVar3 = EbmlMasterElementSize(0x114d9b74,uVar2 * 5);
  iVar1 = (*writer->_vptr_IMkvWriter[1])(writer);
  this->start_pos_ = CONCAT44(extraout_var,iVar1);
  uVar3 = WriteVoidElement(writer,uVar3 + uVar2 * 5);
  return uVar3 != 0;
}

Assistant:

bool SeekHead::Write(IMkvWriter* writer) {
  const uint64_t entry_size = kSeekEntryCount * MaxEntrySize();
  const uint64_t size =
      EbmlMasterElementSize(libwebm::kMkvSeekHead, entry_size);

  start_pos_ = writer->Position();

  const uint64_t bytes_written = WriteVoidElement(writer, size + entry_size);
  if (!bytes_written)
    return false;

  return true;
}